

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

Interval * __thiscall
tcu::FloatFormat::roundOut
          (Interval *__return_storage_ptr__,FloatFormat *this,Interval *x,bool roundUnderOverflow)

{
  bool bVar1;
  double dVar2;
  Interval local_68;
  Interval local_50;
  Interval local_38;
  byte local_19;
  Interval *pIStack_18;
  bool roundUnderOverflow_local;
  Interval *x_local;
  FloatFormat *this_local;
  
  local_19 = roundUnderOverflow;
  pIStack_18 = x;
  x_local = (Interval *)this;
  Interval::nan(__return_storage_ptr__,&x->m_hasNaN);
  bVar1 = Interval::empty(pIStack_18);
  if (!bVar1) {
    dVar2 = Interval::lo(pIStack_18);
    dVar2 = roundOut(this,dVar2,false,(bool)(local_19 & 1));
    Interval::Interval(&local_50,dVar2);
    dVar2 = Interval::hi(pIStack_18);
    dVar2 = roundOut(this,dVar2,true,(bool)(local_19 & 1));
    Interval::Interval(&local_68,dVar2);
    Interval::Interval(&local_38,&local_50,&local_68);
    Interval::operator|=(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::roundOut (const Interval& x, bool roundUnderOverflow) const
{
	Interval ret = x.nan();

	if (!x.empty())
		ret |= Interval(roundOut(x.lo(), false, roundUnderOverflow),
						roundOut(x.hi(), true, roundUnderOverflow));

	return ret;
}